

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Deserializer.cpp
# Opt level: O1

size_t __thiscall
adios2::format::BP4Deserializer::ParseMetadata
          (BP4Deserializer *this,BufferSTL *bufferSTL,Engine *engine,bool firstStep)

{
  int iVar1;
  _func_int **pp_Var2;
  pointer pcVar3;
  BufferSTL *bufferSTL_00;
  mapped_type *pmVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  istream *piVar7;
  int *piVar8;
  long lVar9;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var10;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  mapped_type *pmVar11;
  undefined8 uVar12;
  undefined7 in_register_00000009;
  char *pcVar13;
  ulong uVar14;
  unsigned_long uVar15;
  bool bVar16;
  vector<unsigned_long,_std::allocator<unsigned_long>_> selectedSteps;
  string item;
  string selectedStepsStr;
  stringstream ss;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_258;
  size_type local_240;
  BufferSTL *local_238;
  char *local_230;
  undefined8 local_228;
  char local_220 [16];
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  ulong local_1f0;
  unsigned_long local_1e8;
  char *local_1e0;
  string local_1d8;
  key_type local_1b8 [16];
  ios_base local_138 [264];
  
  if ((int)CONCAT71(in_register_00000009,firstStep) == 0) {
    uVar14 = *(ulong *)(&this->field_0x1d0 + (long)this->_vptr_BP4Deserializer[-4]);
  }
  else {
    uVar14 = 0;
  }
  local_1b8[0] = 0;
  local_238 = bufferSTL;
  pmVar4 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)(this->_vptr_BP4Deserializer[-3] + (long)&(this->m_Minifooter).VersionTag
                           ),local_1b8);
  local_240 = (pmVar4->_M_h)._M_element_count;
  pp_Var2 = this->_vptr_BP4Deserializer;
  *(size_type *)(&this->field_0x1d0 + (long)pp_Var2[-4]) = local_240;
  *(size_type *)(&this->field_0x1d8 + (long)pp_Var2[-4]) = local_240 - 1;
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(engine->m_IO->m_Parameters)._M_t,&engine->m_Name);
  local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  if ((_Rb_tree_header *)iVar5._M_node !=
      &(engine->m_IO->m_Parameters)._M_t._M_impl.super__Rb_tree_header) {
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&engine->m_IO->m_Parameters,&engine->m_Name);
    local_210[0] = local_200;
    pcVar3 = (pmVar6->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_210,pcVar3,pcVar3 + pmVar6->_M_string_length);
    local_1f0 = uVar14;
    std::__cxx11::stringstream::stringstream
              ((stringstream *)local_1b8,(string *)local_210,_S_out|_S_in);
    local_230 = local_220;
    local_228 = 0;
    local_220[0] = '\0';
    while (piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)local_1b8,(string *)&local_230,','), pcVar13 = local_230,
          ((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) == 0) {
      piVar8 = __errno_location();
      iVar1 = *piVar8;
      *piVar8 = 0;
      lVar9 = strtol(pcVar13,&local_1e0,10);
      if (local_1e0 == pcVar13) {
        std::__throw_invalid_argument("stoi");
LAB_00597c92:
        uVar12 = std::__throw_out_of_range("stoi");
        if (local_210[0] != local_200) {
          operator_delete(local_210[0]);
        }
        if (local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
          operator_delete(local_258.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(uVar12);
      }
      if (((int)lVar9 != lVar9) || (*piVar8 == 0x22)) goto LAB_00597c92;
      if (*piVar8 == 0) {
        *piVar8 = iVar1;
      }
      local_1e8 = (unsigned_long)(int)lVar9;
      if (local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_258,
                   (iterator)
                   local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_1e8);
      }
      else {
        *local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = local_1e8;
        local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
    if (local_230 != local_220) {
      operator_delete(local_230);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    uVar14 = local_1f0;
    if (local_210[0] != local_200) {
      operator_delete(local_210[0]);
    }
  }
  local_1b8[0] = uVar14;
  if (uVar14 < local_240) {
    uVar15 = 0;
    do {
      if ((local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish ==
           local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start) ||
         (_Var10 = std::
                   __find_if<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                             (local_258.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              local_258.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish,local_1b8),
         _Var10._M_current !=
         local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish)) {
        bVar16 = engine->m_IO->m_ArrayOrder != RowMajor;
        pcVar13 = "Fortran";
        if (!bVar16) {
          pcVar13 = "C++";
        }
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d8,pcVar13,pcVar13 + (ulong)bVar16 * 4 + 3);
        ParsePGIndexPerStep(this,local_238,&local_1d8,0,local_1b8[0] + 1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p);
        }
        bufferSTL_00 = local_238;
        ParseVariablesIndexPerStep(this,local_238,engine,0,local_1b8[0] + 1);
        ParseAttributesIndexPerStep(this,bufferSTL_00,engine,0,local_1b8[0] + 1);
        local_210[0] = (undefined1 *)0x0;
        this_00 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)(this->_vptr_BP4Deserializer[-3] +
                                     (long)&(this->m_Minifooter).VersionTag),(key_type *)local_210);
        local_230 = (char *)(local_1b8[0] + 1);
        pmVar11 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[](this_00,(key_type *)&local_230);
        uVar15 = (pmVar11->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[3];
      }
      local_1b8[0] = local_1b8[0] + 1;
    } while (local_1b8[0] < local_240);
  }
  else {
    uVar15 = 0;
  }
  if (local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return uVar15;
}

Assistant:

size_t BP4Deserializer::ParseMetadata(const BufferSTL &bufferSTL, core::Engine &engine,
                                      const bool firstStep)
{
    const size_t oldSteps = (firstStep ? 0 : m_MetadataSet.StepsCount);
    size_t allSteps = m_MetadataIndexTable[0].size();
    m_MetadataSet.StepsCount = allSteps;
    m_MetadataSet.CurrentStep = allSteps - 1;
    size_t lastposition = 0;
    /* parse the metadata step by step using the pointers saved in the metadata
    index table */
    auto itStepsString = engine.m_IO.m_Parameters.find(engine.m_Name);
    std::vector<size_t> selectedSteps;
    if (itStepsString != engine.m_IO.m_Parameters.end())
    {
        std::string selectedStepsStr = engine.m_IO.m_Parameters[engine.m_Name];
        std::stringstream ss(selectedStepsStr);
        std::string item;

        while (std::getline(ss, item, ','))
        {
            selectedSteps.push_back(std::stoi(item));
        }
    }
    for (size_t i = oldSteps; i < allSteps; i++)
    {
        if (selectedSteps.size() == 0 ||
            std::find(selectedSteps.begin(), selectedSteps.end(), i) != selectedSteps.end())
        {
            ParsePGIndexPerStep(bufferSTL,
                                (engine.m_IO.m_ArrayOrder == ArrayOrdering::RowMajor) ? "C++"
                                                                                      : "Fortran",
                                0, i + 1);
            ParseVariablesIndexPerStep(bufferSTL, engine, 0, i + 1);
            ParseAttributesIndexPerStep(bufferSTL, engine, 0, i + 1);
            lastposition = m_MetadataIndexTable[0][i + 1][3];
        }
    }
    return lastposition;
}